

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O3

_Bool dir_create(char *path)

{
  int iVar1;
  size_t bufsize;
  stat buf_2;
  char buf [512];
  stat sStack_2b8;
  stat local_228 [3];
  
  iVar1 = stat(path,local_228);
  if ((iVar1 == 0) && ((local_228[0].st_mode & 0x4000) != 0)) {
    return true;
  }
  bufsize = 1;
  do {
    if (path[bufsize - 1] == '/') {
      if ((bufsize != 1) && (path[bufsize - 2] != '/')) {
        if (bufsize - 0x203 < 0xfffffffffffffdff) {
          return false;
        }
        my_strcpy((char *)local_228,path,bufsize);
        iVar1 = stat((char *)local_228,&sStack_2b8);
        if (((iVar1 != 0) || ((sStack_2b8.st_mode & 0x4000) == 0)) &&
           (iVar1 = mkdir((char *)local_228,0x1ed), iVar1 != 0)) {
          return false;
        }
      }
    }
    else if (path[bufsize - 1] == '\0') {
      iVar1 = mkdir(path,0x1ed);
      return iVar1 == 0;
    }
    bufsize = bufsize + 1;
  } while( true );
}

Assistant:

bool dir_create(const char *path)
{
	const char *ptr;
	char buf[512];

	/* If the directory already exists then we're done */
	if (dir_exists(path)) return true;

	#ifdef WINDOWS
	/* If we're on windows, we need to skip past the "C:" part. */
	if (isalpha(path[0]) && path[1] == ':') path += 2;
	#endif

	/* Iterate through the path looking for path segments. At each step,
	 * create the path segment if it doesn't already exist. */
	for (ptr = path; *ptr; ptr++) {
		if (*ptr == PATH_SEPC) {
			/* Find the length of the parent path string */
			size_t len = (size_t)(ptr - path);

			/* Skip the initial slash */
			if (len == 0) continue;

			/* If this is a duplicate path separator, continue */
			if (*(ptr - 1) == PATH_SEPC) continue;

			/* We can't handle really big filenames */
			if (len - 1 > 512) return false;

			/* Create the parent path string, plus null-padding */
			my_strcpy(buf, path, len + 1);

			/* Skip if the parent exists */
			if (dir_exists(buf)) continue;

			/* The parent doesn't exist, so create it or fail */
			if (my_mkdir(buf, 0755) != 0) return false;
		}
	}
	return my_mkdir(path, 0755) == 0 ? true : false;
}